

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O0

void ggml_vec_dot_iq4_xs_q8_K
               (int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  __m256 x_00;
  __m256i y_00;
  __m256i y_01;
  __m256i x_01;
  __m256i x_02;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 (*pauVar9) [16];
  long in_RCX;
  float *in_RSI;
  int in_EDI;
  long in_R9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  __m256i p_2;
  __m256i p_1;
  int16_t ls2;
  int16_t ls1;
  __m256i p16_2;
  __m256i p16_1;
  __m256i q4b_2;
  __m256i q4b_1;
  __m256i q8b_2;
  __m256i q8b_1;
  __m128i q4bits_2;
  __m128i q4bits_1;
  int ib;
  __m256i sumi2;
  __m256i sumi1;
  uint16_t sh;
  int8_t *q8;
  uint8_t *qs;
  int ibl;
  __m256 accum;
  __m128i m4b;
  __m128i values128;
  int nb;
  block_q8_K *y;
  block_iq4_xs *x;
  undefined2 in_stack_fffffffffffff878;
  ushort in_stack_fffffffffffff87a;
  ushort in_stack_fffffffffffff87c;
  undefined1 in_stack_fffffffffffff87e;
  undefined1 uVar15;
  undefined8 in_stack_fffffffffffff880;
  undefined8 in_stack_fffffffffffff888;
  undefined8 in_stack_fffffffffffff890;
  undefined8 in_stack_fffffffffffff898;
  undefined8 in_stack_fffffffffffff8a0;
  undefined8 in_stack_fffffffffffff8a8;
  longlong in_stack_fffffffffffff8b0;
  longlong in_stack_fffffffffffff8b8;
  undefined1 in_stack_fffffffffffff8c0 [24];
  int local_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  ushort local_5da;
  undefined1 (*local_5d0) [16];
  int local_5c4;
  undefined1 local_5c0 [16];
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  if (in_EDI < 0) {
    in_EDI = in_EDI + 0xff;
  }
  uVar15 = 0xf;
  auVar2 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
  auVar2 = vpinsrb_avx(auVar2,0xf,2);
  auVar2 = vpinsrb_avx(auVar2,0xf,3);
  auVar2 = vpinsrb_avx(auVar2,0xf,4);
  auVar2 = vpinsrb_avx(auVar2,0xf,5);
  auVar2 = vpinsrb_avx(auVar2,0xf,6);
  auVar2 = vpinsrb_avx(auVar2,0xf,7);
  auVar2 = vpinsrb_avx(auVar2,0xf,8);
  auVar2 = vpinsrb_avx(auVar2,0xf,9);
  auVar2 = vpinsrb_avx(auVar2,0xf,10);
  auVar2 = vpinsrb_avx(auVar2,0xf,0xb);
  auVar2 = vpinsrb_avx(auVar2,0xf,0xc);
  auVar2 = vpinsrb_avx(auVar2,0xf,0xd);
  auVar2 = vpinsrb_avx(auVar2,0xf,0xe);
  auVar2 = vpinsrb_avx(auVar2,0xf,0xf);
  local_5c0 = ZEXT816(0);
  for (local_5c4 = 0; local_5c4 < in_EDI >> 8; local_5c4 = local_5c4 + 1) {
    local_5d0 = (undefined1 (*) [16])(in_RCX + 8 + (long)local_5c4 * 0x88);
    local_5da = *(ushort *)(in_RCX + 2 + (long)local_5c4 * 0x88);
    local_600 = ZEXT1632(ZEXT816(0));
    local_620 = ZEXT1632(ZEXT816(0));
    local_624 = 0;
    while( true ) {
      if (7 < local_624) break;
      auVar12 = *local_5d0;
      auVar1 = *local_5d0;
      pauVar9 = local_5d0 + 1;
      local_5d0 = local_5d0 + 2;
      auVar1 = vpand_avx(auVar1,auVar2);
      auVar13[8] = '\x01';
      auVar13[9] = '\r';
      auVar13[10] = '\x19';
      auVar13[0xb] = '&';
      auVar13[0xc] = '5';
      auVar13[0xd] = 'E';
      auVar13[0xe] = 'Y';
      auVar13[0xf] = 'q';
      auVar13[0] = -0x7f;
      auVar13[1] = -0x68;
      auVar13[2] = -0x53;
      auVar13[3] = -0x41;
      auVar13[4] = -0x31;
      auVar13[5] = -0x23;
      auVar13[6] = -0x16;
      auVar13[7] = -10;
      auVar3 = vpshufb_avx(auVar13,auVar1);
      auVar1 = vpsrlw_avx(auVar12,ZEXT416(4));
      auVar1 = vpand_avx(auVar1,auVar2);
      auVar11[8] = '\x01';
      auVar11[9] = '\r';
      auVar11[10] = '\x19';
      auVar11[0xb] = '&';
      auVar11[0xc] = '5';
      auVar11[0xd] = 'E';
      auVar11[0xe] = 'Y';
      auVar11[0xf] = 'q';
      auVar11[0] = -0x7f;
      auVar11[1] = -0x68;
      auVar11[2] = -0x53;
      auVar11[3] = -0x41;
      auVar11[4] = -0x31;
      auVar11[5] = -0x23;
      auVar11[6] = -0x16;
      auVar11[7] = -10;
      auVar1 = vpshufb_avx(auVar11,auVar1);
      auVar11 = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
      auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      auVar1 = vpand_avx(*pauVar9,auVar2);
      auVar3[8] = '\x01';
      auVar3[9] = '\r';
      auVar3[10] = '\x19';
      auVar3[0xb] = '&';
      auVar3[0xc] = '5';
      auVar3[0xd] = 'E';
      auVar3[0xe] = 'Y';
      auVar3[0xf] = 'q';
      auVar3[0] = -0x7f;
      auVar3[1] = -0x68;
      auVar3[2] = -0x53;
      auVar3[3] = -0x41;
      auVar3[4] = -0x31;
      auVar3[5] = -0x23;
      auVar3[6] = -0x16;
      auVar3[7] = -10;
      auVar3 = vpshufb_avx(auVar3,auVar1);
      auVar1 = vpsrlw_avx(*pauVar9,ZEXT416(4));
      auVar1 = vpand_avx(auVar1,auVar2);
      auVar12[8] = '\x01';
      auVar12[9] = '\r';
      auVar12[10] = '\x19';
      auVar12[0xb] = '&';
      auVar12[0xc] = '5';
      auVar12[0xd] = 'E';
      auVar12[0xe] = 'Y';
      auVar12[0xf] = 'q';
      auVar12[0] = -0x7f;
      auVar12[1] = -0x68;
      auVar12[2] = -0x53;
      auVar12[3] = -0x41;
      auVar12[4] = -0x31;
      auVar12[5] = -0x23;
      auVar12[6] = -0x16;
      auVar12[7] = -10;
      auVar1 = vpshufb_avx(auVar12,auVar1);
      auVar12 = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
      auVar14 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      x_01[1] = in_stack_fffffffffffff8c0._0_8_;
      x_01[2] = in_stack_fffffffffffff8c0._8_8_;
      x_01[3] = in_stack_fffffffffffff8c0._16_8_;
      x_01[0] = in_stack_fffffffffffff8b8;
      y_00[1] = in_stack_fffffffffffff8a0;
      y_00[0] = in_stack_fffffffffffff898;
      y_00[2] = in_stack_fffffffffffff8a8;
      y_00[3] = in_stack_fffffffffffff8b0;
      mul_add_epi8(x_01,y_00);
      x_02[1] = in_stack_fffffffffffff8c0._0_8_;
      x_02[2] = in_stack_fffffffffffff8c0._8_8_;
      x_02[3] = in_stack_fffffffffffff8c0._16_8_;
      x_02[0] = in_stack_fffffffffffff8b8;
      y_01[1] = in_stack_fffffffffffff8a0;
      y_01[0] = in_stack_fffffffffffff898;
      y_01[2] = in_stack_fffffffffffff8a8;
      y_01[3] = in_stack_fffffffffffff8b0;
      mul_add_epi8(x_02,y_01);
      in_stack_fffffffffffff87a =
           ((*(byte *)((long)(local_624 / 2) + 4 + in_RCX + (long)local_5c4 * 0x88) & 0xf) - 0x20) +
           (local_5da & 3) * 0x10;
      in_stack_fffffffffffff87c =
           ((*(byte *)((long)(local_624 / 2) + 4 + in_RCX + (long)local_5c4 * 0x88) >> 4) - 0x20) +
           (local_5da & 0xc) * 4;
      local_5da = local_5da >> 4;
      auVar1 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff87a),(uint)in_stack_fffffffffffff87a,1);
      auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff87a,2);
      auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff87a,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff87a,4);
      auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff87a,5);
      auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff87a,6);
      auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff87a,7);
      auVar3 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff87a),(uint)in_stack_fffffffffffff87a,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)in_stack_fffffffffffff87a,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)in_stack_fffffffffffff87a,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)in_stack_fffffffffffff87a,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)in_stack_fffffffffffff87a,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)in_stack_fffffffffffff87a,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)in_stack_fffffffffffff87a,7);
      uStack_230 = auVar3._0_8_;
      uStack_228 = auVar3._8_8_;
      auVar8._16_8_ = auVar13._0_8_;
      auVar8._0_16_ = auVar11;
      auVar8._24_8_ = auVar13._8_8_;
      auVar4._16_8_ = uStack_230;
      auVar4._0_16_ = auVar1;
      auVar4._24_8_ = uStack_228;
      auVar4 = vpmaddwd_avx2(auVar8,auVar4);
      in_stack_fffffffffffff8a0 = auVar4._0_8_;
      in_stack_fffffffffffff8a8 = auVar4._8_8_;
      in_stack_fffffffffffff8b0 = auVar4._16_8_;
      in_stack_fffffffffffff8b8 = auVar4._24_8_;
      auVar1 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff87c),(uint)in_stack_fffffffffffff87c,1);
      auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff87c,2);
      auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff87c,3);
      auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff87c,4);
      auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff87c,5);
      auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff87c,6);
      auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff87c,7);
      auVar3 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff87c),(uint)in_stack_fffffffffffff87c,1);
      auVar3 = vpinsrw_avx(auVar3,(uint)in_stack_fffffffffffff87c,2);
      auVar3 = vpinsrw_avx(auVar3,(uint)in_stack_fffffffffffff87c,3);
      auVar3 = vpinsrw_avx(auVar3,(uint)in_stack_fffffffffffff87c,4);
      auVar3 = vpinsrw_avx(auVar3,(uint)in_stack_fffffffffffff87c,5);
      auVar3 = vpinsrw_avx(auVar3,(uint)in_stack_fffffffffffff87c,6);
      auVar3 = vpinsrw_avx(auVar3,(uint)in_stack_fffffffffffff87c,7);
      auVar11 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      uStack_290 = auVar11._0_8_;
      uStack_288 = auVar11._8_8_;
      auVar7._16_8_ = auVar14._0_8_;
      auVar7._0_16_ = auVar12;
      auVar7._24_8_ = auVar14._8_8_;
      auVar5._16_8_ = uStack_290;
      auVar5._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar3;
      auVar5._24_8_ = uStack_288;
      auVar5 = vpmaddwd_avx2(auVar7,auVar5);
      in_stack_fffffffffffff880 = auVar5._0_8_;
      in_stack_fffffffffffff888 = auVar5._8_8_;
      in_stack_fffffffffffff890 = auVar5._16_8_;
      in_stack_fffffffffffff898 = auVar5._24_8_;
      local_600 = vpaddd_avx2(auVar4,local_600);
      local_620 = vpaddd_avx2(auVar5,local_620);
      local_624 = local_624 + 2;
    }
    fVar10 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RCX + (long)local_5c4 * 0x88));
    fVar10 = fVar10 * *(float *)(in_R9 + (long)local_5c4 * 0x124);
    auVar1 = vinsertps_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)fVar10),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)fVar10),0x30);
    auVar3 = vinsertps_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar10),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar10),0x30);
    uStack_90 = auVar1._0_8_;
    uStack_88 = auVar1._8_8_;
    auVar4 = vpaddd_avx2(local_600,local_620);
    auVar4 = vcvtdq2ps_avx(auVar4);
    auVar6._16_8_ = uStack_90;
    auVar6._0_16_ = auVar3;
    auVar6._24_8_ = uStack_88;
    local_5c0 = vfmadd213ps_fma(auVar4,auVar6,ZEXT1632(local_5c0));
  }
  x_00[0]._2_2_ = in_stack_fffffffffffff87a;
  x_00[0]._0_2_ = in_stack_fffffffffffff878;
  x_00[1]._0_2_ = in_stack_fffffffffffff87c;
  x_00[1]._2_1_ = in_stack_fffffffffffff87e;
  x_00[1]._3_1_ = uVar15;
  x_00[2] = (float)(int)in_stack_fffffffffffff880;
  x_00[3] = (float)(int)((ulong)in_stack_fffffffffffff880 >> 0x20);
  x_00[4] = (float)(int)in_stack_fffffffffffff888;
  x_00[5] = (float)(int)((ulong)in_stack_fffffffffffff888 >> 0x20);
  x_00[6] = (float)(int)in_stack_fffffffffffff890;
  x_00[7] = (float)(int)((ulong)in_stack_fffffffffffff890 >> 0x20);
  fVar10 = hsum_float_8(x_00);
  *in_RSI = fVar10;
  return;
}

Assistant:

void ggml_vec_dot_iq4_xs_q8_K(int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);
    assert(n % QK_K == 0);

    const block_iq4_xs * GGML_RESTRICT x = vx;
    const block_q8_K   * GGML_RESTRICT y = vy;

    const int nb = n / QK_K;

#if defined __ARM_NEON
    const int8x16_t values = vld1q_s8(kvalues_iq4nl);
    const uint8x16_t m4b = vdupq_n_u8(0x0f);
    ggml_uint8x16x2_t q4bits;
    ggml_int8x16x4_t q4b;
    ggml_int8x16x4_t q8b;
    int32x4_t prod_1, prod_2;

    float sumf = 0;

    for (int ibl = 0; ibl < nb; ++ibl) {

        const int8_t  * q8 = y[ibl].qs;
        const uint8_t * q4 = x[ibl].qs;
        uint16_t h = x[ibl].scales_h;

        int sumi1 = 0, sumi2 = 0;
        for (int ib = 0; ib < QK_K/64; ++ib) {

            q4bits = ggml_vld1q_u8_x2(q4); q4 += 32;
            q8b    = ggml_vld1q_s8_x4(q8); q8 += 64;

            q4b.val[0] = ggml_vqtbl1q_s8(values, vandq_u8  (q4bits.val[0], m4b));
            q4b.val[1] = ggml_vqtbl1q_s8(values, vshrq_n_u8(q4bits.val[0], 4));
            q4b.val[2] = ggml_vqtbl1q_s8(values, vandq_u8  (q4bits.val[1], m4b));
            q4b.val[3] = ggml_vqtbl1q_s8(values, vshrq_n_u8(q4bits.val[1], 4));

            prod_1 = ggml_vdotq_s32(ggml_vdotq_s32(vdupq_n_s32(0), q4b.val[0], q8b.val[0]), q4b.val[1], q8b.val[1]);
            prod_2 = ggml_vdotq_s32(ggml_vdotq_s32(vdupq_n_s32(0), q4b.val[2], q8b.val[2]), q4b.val[3], q8b.val[3]);

            int ls1 = ((x[ibl].scales_l[ib] & 0xf) | ((h << 4) & 0x30)) - 32;
            int ls2 = ((x[ibl].scales_l[ib] >>  4) | ((h << 2) & 0x30)) - 32;
            h >>= 4;
            sumi1 += vaddvq_s32(prod_1) * ls1;
            sumi2 += vaddvq_s32(prod_2) * ls2;

        }

        sumf += GGML_FP16_TO_FP32(x[ibl].d) * y[ibl].d * (sumi1 + sumi2);
    }

    *s = sumf;

#elif defined __AVX2__

    const __m128i values128 = _mm_loadu_si128((const __m128i*)kvalues_iq4nl);
    const __m128i m4b  = _mm_set1_epi8(0x0f);

    __m256 accum = _mm256_setzero_ps();
    for (int ibl = 0; ibl < nb; ++ibl) {
        const uint8_t * qs = x[ibl].qs;
        const int8_t  * q8 = y[ibl].qs;
        uint16_t sh = x[ibl].scales_h;
        __m256i sumi1 = _mm256_setzero_si256();
        __m256i sumi2 = _mm256_setzero_si256();
        for (int ib = 0; ib < QK_K/32; ib += 2) {
            const __m128i q4bits_1 = _mm_loadu_si128((const __m128i*)qs);  qs += 16;
            const __m128i q4bits_2 = _mm_loadu_si128((const __m128i*)qs);  qs += 16;
            const __m256i q8b_1 = _mm256_loadu_si256((const __m256i *)q8); q8 += 32;
            const __m256i q8b_2 = _mm256_loadu_si256((const __m256i *)q8); q8 += 32;
            const __m256i q4b_1 = MM256_SET_M128I(_mm_shuffle_epi8(values128, _mm_and_si128(_mm_srli_epi16(q4bits_1, 4), m4b)),
                                                  _mm_shuffle_epi8(values128, _mm_and_si128(q4bits_1, m4b)));
            const __m256i q4b_2 = MM256_SET_M128I(_mm_shuffle_epi8(values128, _mm_and_si128(_mm_srli_epi16(q4bits_2, 4), m4b)),
                                                  _mm_shuffle_epi8(values128, _mm_and_si128(q4bits_2, m4b)));
            const __m256i p16_1 = mul_add_epi8(q4b_1, q8b_1);
            const __m256i p16_2 = mul_add_epi8(q4b_2, q8b_2);
            const int16_t ls1 = ((x[ibl].scales_l[ib/2] & 0xf) | ((sh << 4) & 0x30)) - 32;
            const int16_t ls2 = ((x[ibl].scales_l[ib/2] >>  4) | ((sh << 2) & 0x30)) - 32;
            sh >>= 4;
            const __m256i p_1 = _mm256_madd_epi16(p16_1, _mm256_set1_epi16(ls1));
            const __m256i p_2 = _mm256_madd_epi16(p16_2, _mm256_set1_epi16(ls2));
            sumi1 = _mm256_add_epi32(p_1, sumi1);
            sumi2 = _mm256_add_epi32(p_2, sumi2);
        }
        accum = _mm256_fmadd_ps(_mm256_set1_ps(GGML_FP16_TO_FP32(x[ibl].d)*y[ibl].d),
                _mm256_cvtepi32_ps(_mm256_add_epi32(sumi1, sumi2)), accum);
    }

    *s = hsum_float_8(accum);

#elif defined __AVX__
    const __m128i values128 = _mm_loadu_si128((const __m128i*)kvalues_iq4nl);
    const __m128i m4b  = _mm_set1_epi8(0x0f);

    __m256 accum = _mm256_setzero_ps();
    for (int ibl = 0; ibl < nb; ++ibl) {
        const uint8_t * qs = x[ibl].qs;
        const int8_t  * q8 = y[ibl].qs;
        uint16_t sh = x[ibl].scales_h;
        __m128i sumi1_0 = _mm_setzero_si128();
        __m128i sumi1_1 = _mm_setzero_si128();
        __m128i sumi2_0 = _mm_setzero_si128();
        __m128i sumi2_1 = _mm_setzero_si128();
        for (int ib = 0; ib < QK_K/32; ib += 2) {
            const __m128i q4bits_1 = _mm_loadu_si128((const __m128i *)qs); qs += 16;
            const __m128i q4bits_2 = _mm_loadu_si128((const __m128i *)qs); qs += 16;
            const __m128i q8b_1_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8b_1_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8b_2_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8b_2_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q4b_1_0 = _mm_shuffle_epi8(values128, _mm_and_si128(q4bits_1, m4b));
            const __m128i q4b_1_1 = _mm_shuffle_epi8(values128, _mm_and_si128(_mm_srli_epi16(q4bits_1, 4), m4b));
            const __m128i q4b_2_0 = _mm_shuffle_epi8(values128, _mm_and_si128(q4bits_2, m4b));
            const __m128i q4b_2_1 = _mm_shuffle_epi8(values128, _mm_and_si128(_mm_srli_epi16(q4bits_2, 4), m4b));
            const __m128i p16_1_0 = mul_add_epi8_sse(q4b_1_0, q8b_1_0);
            const __m128i p16_1_1 = mul_add_epi8_sse(q4b_1_1, q8b_1_1);
            const __m128i p16_2_0 = mul_add_epi8_sse(q4b_2_0, q8b_2_0);
            const __m128i p16_2_1 = mul_add_epi8_sse(q4b_2_1, q8b_2_1);
            const int16_t ls1 = ((x[ibl].scales_l[ib/2] & 0xf) | ((sh << 4) & 0x30)) - 32;
            const int16_t ls2 = ((x[ibl].scales_l[ib/2] >>  4) | ((sh << 2) & 0x30)) - 32;
            sh >>= 4;
            const __m128i p_1_0 = _mm_madd_epi16(p16_1_0, _mm_set1_epi16(ls1));
            const __m128i p_1_1 = _mm_madd_epi16(p16_1_1, _mm_set1_epi16(ls1));
            const __m128i p_2_0 = _mm_madd_epi16(p16_2_0, _mm_set1_epi16(ls2));
            const __m128i p_2_1 = _mm_madd_epi16(p16_2_1, _mm_set1_epi16(ls2));
            sumi1_0 = _mm_add_epi32(p_1_0, sumi1_0);
            sumi1_1 = _mm_add_epi32(p_1_1, sumi1_1);
            sumi2_0 = _mm_add_epi32(p_2_0, sumi2_0);
            sumi2_1 = _mm_add_epi32(p_2_1, sumi2_1);
        }
        __m128i sumi12_0 = _mm_add_epi32(sumi1_0, sumi2_0);
        __m128i sumi12_1 = _mm_add_epi32(sumi1_1, sumi2_1);
        accum = _mm256_add_ps(_mm256_mul_ps(_mm256_set1_ps(GGML_FP16_TO_FP32(x[ibl].d)*y[ibl].d),
                _mm256_cvtepi32_ps(MM256_SET_M128I(sumi12_1, sumi12_0))), accum);
    }

    *s = hsum_float_8(accum);

#elif defined(__POWER9_VECTOR__)
    const vector signed char lowMask = vec_splats((signed char)0xF);
    const vector int v0 = vec_splats((int32_t)0);
    const vector unsigned char v4 = vec_splats((unsigned char)0x4);

    vector float vsumf0 = vec_splats(0.0f);
    vector float vsumf1 = vec_splats(0.0f);
    vector float vsumf2 = vec_splats(0.0f);
    vector float vsumf3 = vec_splats(0.0f);

    const vector signed char values = vec_xl( 0, kvalues_iq4nl);

    for (int ibl = 0; ibl < nb; ++ibl) {

        vector float vxd = vec_splats(GGML_FP16_TO_FP32(x[ibl].d));
        vector float vyd = vec_splats(y[ibl].d);
        vector float vd = vec_mul(vxd, vyd);

        vector signed int vsumi0 = v0;
        vector signed int vsumi1 = v0;
        vector signed int vsumi2 = v0;
        vector signed int vsumi3 = v0;

        uint16_t h = x[ibl].scales_h;

        const uint8_t * GGML_RESTRICT q4 = x[ibl].qs;
        const uint8_t * GGML_RESTRICT sc = x[ibl].scales_l;
        const int8_t  * GGML_RESTRICT q8 = y[ibl].qs;

        for (int ib = 0; ib < QK_K/64; ib ++ ) {
            __builtin_prefetch(q4, 0, 1);
            __builtin_prefetch(q8, 0, 1);

            vector signed char qxs0 = (vector signed char)vec_xl( 0, q4);
            vector signed char qxs1 = (vector signed char)vec_xl(16, q4);
            q4 += 32;

            vector signed char q4x00 = (vector signed char)vec_and(qxs0, lowMask);
            vector signed char q4x01 = (vector signed char)vec_sr(qxs0, v4);
            vector signed char q4x10 = (vector signed char)vec_and(qxs1, lowMask);
            vector signed char q4x11 = (vector signed char)vec_sr(qxs1, v4);

            q4x00 = vec_perm(values, values, (vector unsigned char)q4x00);
            q4x01 = vec_perm(values, values, (vector unsigned char)q4x01);
            q4x10 = vec_perm(values, values, (vector unsigned char)q4x10);
            q4x11 = vec_perm(values, values, (vector unsigned char)q4x11);

            vector signed char q8y0 = vec_xl( 0, q8);
            vector signed char q8y1 = vec_xl(16, q8);
            vector signed char q8y2 = vec_xl(32, q8);
            vector signed char q8y3 = vec_xl(48, q8);
            q8 += 64;

            vector signed short qv0 = vec_add(vec_mule(q4x00, q8y0), vec_mulo(q4x00, q8y0));
            vector signed short qv1 = vec_add(vec_mule(q4x01, q8y1), vec_mulo(q4x01, q8y1));
            vector signed short qv2 = vec_add(vec_mule(q4x10, q8y2), vec_mulo(q4x10, q8y2));
            vector signed short qv3 = vec_add(vec_mule(q4x11, q8y3), vec_mulo(q4x11, q8y3));

            const uint16_t ls0 = (uint16_t)(((sc[0] & 0xf) | ((h << 4) & 0x30)) - 32);
            const uint16_t ls1 = (uint16_t)(((sc[0] >>  4) | ((h << 2) & 0x30)) - 32);
            h >>= 4;
            sc ++;

            vector signed short vscales01 = vec_splats((int16_t)ls0);
            vector signed short vscales23 = vec_splats((int16_t)ls1);

            vsumi0 = vec_msum(qv0, vscales01, vsumi0);
            vsumi1 = vec_msum(qv1, vscales01, vsumi1);
            vsumi2 = vec_msum(qv2, vscales23, vsumi2);
            vsumi3 = vec_msum(qv3, vscales23, vsumi3);
        }

        vsumf0 = vec_madd(vec_ctf(vsumi0, 0), vd, vsumf0);
        vsumf1 = vec_madd(vec_ctf(vsumi1, 0), vd, vsumf1);
        vsumf2 = vec_madd(vec_ctf(vsumi2, 0), vd, vsumf2);
        vsumf3 = vec_madd(vec_ctf(vsumi3, 0), vd, vsumf3);
    }

    vsumf0 = vec_add(vsumf0, vsumf2);
    vsumf1 = vec_add(vsumf1, vsumf3);

    vsumf0 = vec_add(vsumf0, vsumf1);

    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 4));
    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 8));

    *s = vec_extract(vsumf0, 0);

#elif defined(__loongarch_asx)

    const __m128i values128 = __lsx_vld((const __m128i*)kvalues_iq4nl, 0);

    __m256 accum = (__m256)__lasx_xvldi(0);

    for (int ibl = 0; ibl < nb; ++ibl) {
        const uint8_t * qs = x[ibl].qs;
        const int8_t  * q8 = y[ibl].qs;
        uint16_t sh = x[ibl].scales_h;
        __m256i sumi1 = __lasx_xvldi(0);
        __m256i sumi2 = __lasx_xvldi(0);
        for (int ib = 0; ib < QK_K/32; ib += 2) {
            const __m128i q4bits_1 = __lsx_vld((const __m128i*)qs, 0); qs += 16;
            const __m128i q4bits_2 = __lsx_vld((const __m128i*)qs, 0); qs += 16;
            const __m256i q8b_1 = __lasx_xvld((const __m256i *)q8, 0); q8 += 32;
            const __m256i q8b_2 = __lasx_xvld((const __m256i *)q8, 0); q8 += 32;
            const __m256i q4b_1 = lasx_insertf128(__lsx_vshuf_b(values128, values128, __lsx_vsrli_b(q4bits_1, 4)),
                                                  __lsx_vshuf_b(values128, values128, __lsx_vandi_b(q4bits_1, 0xf)));
            const __m256i q4b_2 = lasx_insertf128(__lsx_vshuf_b(values128, values128, __lsx_vsrli_b(q4bits_2, 4)),
                                                  __lsx_vshuf_b(values128, values128, __lsx_vandi_b(q4bits_2, 0xf)));
            const __m256i p16_1 = mul_add_epi8(q4b_1, q8b_1);
            const __m256i p16_2 = mul_add_epi8(q4b_2, q8b_2);
            const int16_t ls1 = ((x[ibl].scales_l[ib/2] & 0xf) | ((sh << 4) & 0x30)) - 32;
            const int16_t ls2 = ((x[ibl].scales_l[ib/2] >>  4) | ((sh << 2) & 0x30)) - 32;
            sh >>= 4;
            const __m256i p_1 = lasx_madd_h(p16_1, __lasx_xvreplgr2vr_h(ls1));
            const __m256i p_2 = lasx_madd_h(p16_2, __lasx_xvreplgr2vr_h(ls2));
            sumi1 = __lasx_xvadd_w(p_1, sumi1);
            sumi2 = __lasx_xvadd_w(p_2, sumi2);
        }
        accum = __lasx_xvfmadd_s(__lasx_xvreplfr2vr_s(GGML_FP16_TO_FP32(x[ibl].d)*y[ibl].d),
                __lasx_xvffint_s_w(__lasx_xvadd_w(sumi1, sumi2)), accum);
    }

    *s = hsum_float_8(accum);
#elif defined(__VXE__) || defined(__VXE2__)
    const int8x16_t v_k = vec_xl(0, kvalues_iq4nl);
    const uint8x16_t v_m = vec_splat_u8(0x0F);

    float sumf = 0;

    for (int ibl = 0; ibl < nb; ++ibl) {
        const uint8_t * GGML_RESTRICT q4 = x[ibl].qs;
        const int8_t  * GGML_RESTRICT q8 = y[ibl].qs;

        uint16_t h = x[ibl].scales_h;

        int sumi1 = 0, sumi2 = 0;
        for (int ib = 0; ib < QK_K/64; ++ib) {
            const uint8x16_t v_x0 = vec_xl(0       , q4);
            const uint8x16_t v_x1 = vec_xl(QK4_NL/2, q4);
            q4 += 32;

            int8x16_t v_x0l = (int8x16_t)vec_and(v_x0, v_m);
            int8x16_t v_x0h = (int8x16_t)vec_sr(v_x0, 4);
            int8x16_t v_x1l = (int8x16_t)vec_and(v_x1, v_m);
            int8x16_t v_x1h = (int8x16_t)vec_sr(v_x1, 4);

            v_x0l = vec_perm(v_k, v_k, (uchar8x16_t)v_x0l);
            v_x0h = vec_perm(v_k, v_k, (uchar8x16_t)v_x0h);
            v_x1l = vec_perm(v_k, v_k, (uchar8x16_t)v_x1l);
            v_x1h = vec_perm(v_k, v_k, (uchar8x16_t)v_x1h);

            const int8x16_t v_y0 = vec_xl( 0, q8);
            const int8x16_t v_y1 = vec_xl(16, q8);
            const int8x16_t v_y2 = vec_xl(32, q8);
            const int8x16_t v_y3 = vec_xl(48, q8);
            q8 += 64;

            int32x4_t vsumi0 = ggml_vec_dot(ggml_vec_dot(vec_splats(0), v_x0l, v_y0), v_x0h, v_y1);
            int32x4_t vsumi1 = ggml_vec_dot(ggml_vec_dot(vec_splats(0), v_x1l, v_y2), v_x1h, v_y3);

            int ls1 = ((x[ibl].scales_l[ib] & 0xF) | ((h << 4) & 0x30)) - 32;
            int ls2 = ((x[ibl].scales_l[ib] >>  4) | ((h << 2) & 0x30)) - 32;

            h >>= 4;

            sumi1 += (vsumi0[0] + vsumi0[1] + vsumi0[2] + vsumi0[3]) * ls1;
            sumi2 += (vsumi1[0] + vsumi1[1] + vsumi1[2] + vsumi1[3]) * ls2;
        }

        sumf += GGML_FP16_TO_FP32(x[ibl].d) * y[ibl].d * (sumi1 + sumi2);
    }

    *s = sumf;

#else
    float sumf = 0;
    for (int ibl = 0; ibl < nb; ++ibl) {
        const float d4d8 = GGML_FP16_TO_FP32(x[ibl].d) * y[ibl].d;
        uint16_t h = x[ibl].scales_h;
        const uint8_t * qs = x[ibl].qs;
        const int8_t  * q8 = y[ibl].qs;
        for (int ib = 0; ib < QK_K/32; ib += 2) {
            const uint8_t ls1 = (x[ibl].scales_l[ib/2] & 0xf) | ((h << 4) & 0x30);
            const uint8_t ls2 = (x[ibl].scales_l[ib/2] >>  4) | ((h << 2) & 0x30);
            h >>= 4;
            const float d1 = d4d8*(ls1 - 32);
            const float d2 = d4d8*(ls2 - 32);
            int sumi1 = 0, sumi2 = 0;
            for (int j = 0; j < 16; ++j) {
                sumi1 += q8[j+ 0] * kvalues_iq4nl[qs[j] & 0xf];
                sumi2 += q8[j+16] * kvalues_iq4nl[qs[j] >>  4];
            }
            sumf += d1 * (sumi1 + sumi2);
            qs += 16;
            q8 += 32;
            sumi1 = sumi2 = 0;
            for (int j = 0; j < 16; ++j) {
                sumi1 += q8[j+ 0] * kvalues_iq4nl[qs[j] & 0xf];
                sumi2 += q8[j+16] * kvalues_iq4nl[qs[j] >>  4];
            }
            sumf += d2 * (sumi1 + sumi2);
            qs += 16;
            q8 += 32;
        }
    }
    *s = sumf;
#endif
}